

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O1

cgltf_result cgltf_validate(cgltf_data *data)

{
  cgltf_component_type cVar1;
  cgltf_meshopt_compression_mode cVar2;
  ulong uVar3;
  cgltf_buffer_view *pcVar4;
  cgltf_mesh *pcVar5;
  ulong uVar6;
  cgltf_primitive *pcVar7;
  cgltf_accessor *pcVar8;
  cgltf_primitive *pcVar9;
  cgltf_accessor *pcVar10;
  cgltf_node **ppcVar11;
  cgltf_animation_sampler *pcVar12;
  cgltf_result cVar13;
  cgltf_size cVar14;
  cgltf_meshopt_compression_filter *pcVar15;
  ulong uVar16;
  cgltf_size *pcVar17;
  cgltf_result cVar18;
  cgltf_accessor **ppcVar19;
  cgltf_result unaff_EBP;
  ulong uVar20;
  cgltf_node *pcVar21;
  cgltf_size cVar22;
  long lVar23;
  cgltf_node *pcVar24;
  ulong uVar25;
  cgltf_animation_path_type *pcVar26;
  ulong uVar27;
  char cVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  
  uVar3 = data->accessors_count;
  bVar29 = uVar3 != 0;
  if (bVar29) {
    pcVar17 = &(data->accessors->sparse).values_byte_offset;
    uVar20 = 1;
    do {
      cVar14 = cgltf_calc_size(*(cgltf_type *)(pcVar17 + -0x1c),
                               *(cgltf_component_type *)(pcVar17 + -0x1d));
      if ((pcVar17[-0x18] == 0) ||
         (pcVar17[-0x1b] + cVar14 + (pcVar17[-0x1a] + -1) * pcVar17[-0x19] <=
          *(ulong *)(pcVar17[-0x18] + 0x10))) {
        if ((int)pcVar17[-6] == 0) {
LAB_001050ec:
          bVar30 = true;
          cVar18 = unaff_EBP;
        }
        else {
          cVar1 = *(cgltf_component_type *)(pcVar17 + -2);
          if (cVar1 - cgltf_component_type_r_8 < 6) {
            lVar23 = *(long *)(&DAT_0011e1a8 + (ulong)(cVar1 - cgltf_component_type_r_8) * 8);
          }
          else {
            lVar23 = 0;
          }
          cVar22 = ((cgltf_accessor_sparse *)(pcVar17 + -5))->count;
          pcVar4 = (cgltf_buffer_view *)pcVar17[-4];
          if ((pcVar4->size < lVar23 * cVar22 + pcVar17[-3]) ||
             (((cgltf_buffer_view *)pcVar17[-1])->size < cVar14 * cVar22 + *pcVar17))
          goto LAB_001050ab;
          bVar30 = false;
          cVar18 = cgltf_result_invalid_gltf;
          if ((cVar1 < cgltf_component_type_r_32f) && ((0x34U >> (cVar1 & 0x1f) & 1) != 0)) {
            if (pcVar4->buffer->data == (void *)0x0) goto LAB_001050ec;
            cVar14 = cgltf_calc_index_bound(pcVar4,pcVar17[-3],cVar1,cVar22);
            bVar30 = cVar14 < pcVar17[-0x1a];
            cVar18 = unaff_EBP;
            if (!bVar30) {
              cVar18 = cgltf_result_data_too_short;
            }
          }
        }
      }
      else {
LAB_001050ab:
        bVar30 = false;
        cVar18 = cgltf_result_data_too_short;
      }
      unaff_EBP = cVar18;
      if (!bVar30) break;
      bVar29 = uVar20 < uVar3;
      pcVar17 = pcVar17 + 0x2e;
      bVar30 = uVar20 != uVar3;
      uVar20 = uVar20 + 1;
    } while (bVar30);
  }
  if (!bVar29) {
    uVar3 = data->buffer_views_count;
    bVar29 = uVar3 != 0;
    if (bVar29) {
      pcVar15 = &(data->buffer_views->meshopt_compression).filter;
      uVar20 = 1;
      do {
        if ((*(ulong **)(pcVar15 + -0x19) == (ulong *)0x0) ||
           ((ulong)(*(long *)(pcVar15 + -0x15) + *(long *)(pcVar15 + -0x17)) <=
            **(ulong **)(pcVar15 + -0x19))) {
          bVar30 = true;
          if (pcVar15[-0xd] != 0) {
            if ((((cgltf_meshopt_compression *)(pcVar15 + -0xb))->buffer == (cgltf_buffer *)0x0) ||
               (((cgltf_meshopt_compression *)(pcVar15 + -0xb))->buffer->size <
                *(cgltf_size *)(pcVar15 + -7) + *(cgltf_size *)(pcVar15 + -9))) {
              bVar30 = false;
              unaff_EBP = cgltf_result_data_too_short;
            }
            else {
              if ((*(cgltf_size *)(pcVar15 + -0x13) != 0) &&
                 (*(cgltf_size *)(pcVar15 + -5) != *(cgltf_size *)(pcVar15 + -0x13))) {
                unaff_EBP = cgltf_result_invalid_gltf;
                goto LAB_0010518c;
              }
              uVar6 = *(ulong *)(pcVar15 + -5);
              if ((*(long *)(pcVar15 + -0x15) == *(cgltf_size *)(pcVar15 + -3) * uVar6) &&
                 (cVar2 = pcVar15[-1], cVar2 != cgltf_meshopt_compression_mode_invalid)) {
                if (cVar2 == cgltf_meshopt_compression_mode_triangles) {
                  if (*(cgltf_size *)(pcVar15 + -3) * -0x5555555555555555 < 0x5555555555555556)
                  goto LAB_0010524d;
                }
                else if ((cVar2 != cgltf_meshopt_compression_mode_attributes) ||
                        (uVar6 < 0x101 && (uVar6 & 3) == 0)) {
LAB_0010524d:
                  if (((cVar2 & ~cgltf_meshopt_compression_mode_attributes) !=
                       cgltf_meshopt_compression_mode_triangles) ||
                     (((uVar6 == 4 || (uVar6 == 2)) &&
                      (*pcVar15 == cgltf_meshopt_compression_filter_none)))) {
                    if (*pcVar15 == cgltf_meshopt_compression_filter_quaternion) {
                      if (uVar6 != 8) goto LAB_001052a5;
                    }
                    else if (((*pcVar15 == cgltf_meshopt_compression_filter_octahedral) &&
                             (uVar6 != 8)) && (uVar6 != 4)) goto LAB_001052a5;
                    goto LAB_001052ad;
                  }
                }
              }
LAB_001052a5:
              bVar30 = false;
              unaff_EBP = cgltf_result_invalid_gltf;
            }
          }
        }
        else {
          unaff_EBP = cgltf_result_data_too_short;
LAB_0010518c:
          bVar30 = false;
        }
LAB_001052ad:
        if (!bVar30) break;
        bVar29 = uVar20 < uVar3;
        pcVar15 = pcVar15 + 0x24;
        bVar30 = uVar20 != uVar3;
        uVar20 = uVar20 + 1;
      } while (bVar30);
    }
    if (!bVar29) {
      uVar3 = data->meshes_count;
      bVar29 = uVar3 != 0;
      if (bVar29) {
        pcVar5 = data->meshes;
        uVar20 = 0;
        do {
          if ((((pcVar5[uVar20].weights != (cgltf_float *)0x0) &&
               (pcVar5[uVar20].primitives_count != 0)) &&
              ((pcVar5[uVar20].primitives)->targets_count != pcVar5[uVar20].weights_count)) ||
             (((pcVar5[uVar20].target_names != (char **)0x0 &&
               (pcVar5[uVar20].primitives_count != 0)) &&
              ((pcVar5[uVar20].primitives)->targets_count != pcVar5[uVar20].target_names_count)))) {
            unaff_EBP = cgltf_result_invalid_gltf;
            break;
          }
          uVar6 = pcVar5[uVar20].primitives_count;
          bVar30 = uVar6 != 0;
          if (bVar30) {
            pcVar7 = pcVar5[uVar20].primitives;
            uVar27 = 0;
            do {
              if (pcVar7[uVar27].attributes_count != 0) {
                pcVar8 = (pcVar7[uVar27].attributes)->data;
                if (pcVar8 == (cgltf_accessor *)0x0) {
                  cVar28 = '\r';
                  cVar18 = unaff_EBP;
                }
                else {
                  pcVar9 = pcVar5[uVar20].primitives;
                  uVar25 = pcVar9[uVar27].attributes_count;
                  cVar28 = '\x0e';
                  bVar31 = uVar25 != 0;
                  if (bVar31) {
                    ppcVar19 = &(pcVar9[uVar27].attributes)->data;
                    uVar16 = 1;
                    do {
                      if ((*ppcVar19 == (cgltf_accessor *)0x0) ||
                         ((*ppcVar19)->count == pcVar8->count)) {
                        bVar32 = true;
                      }
                      else {
                        unaff_EBP = cgltf_result_invalid_gltf;
                        bVar32 = false;
                      }
                      if (!bVar32) {
                        cVar28 = '\x01';
                        goto LAB_00105459;
                      }
                      bVar31 = uVar16 < uVar25;
                      ppcVar19 = ppcVar19 + 4;
                      bVar32 = uVar16 != uVar25;
                      uVar16 = uVar16 + 1;
                    } while (bVar32);
                    cVar28 = '\x0e';
                  }
LAB_00105459:
                  cVar18 = unaff_EBP;
                  if (!bVar31) {
                    cVar28 = '\x11';
                    if (pcVar9[uVar27].targets_count != 0) {
                      cVar14 = 0;
                      do {
                        uVar25 = pcVar9[uVar27].targets[cVar14].attributes_count;
                        cVar28 = '\x14';
                        bVar31 = uVar25 != 0;
                        if (bVar31) {
                          ppcVar19 = &(pcVar9[uVar27].targets[cVar14].attributes)->data;
                          uVar16 = 1;
                          do {
                            if ((*ppcVar19 == (cgltf_accessor *)0x0) ||
                               ((*ppcVar19)->count == pcVar8->count)) {
                              bVar32 = true;
                            }
                            else {
                              unaff_EBP = cgltf_result_invalid_gltf;
                              bVar32 = false;
                            }
                            if (!bVar32) {
                              cVar28 = '\x01';
                              break;
                            }
                            bVar31 = uVar16 < uVar25;
                            ppcVar19 = ppcVar19 + 4;
                            bVar32 = uVar16 != uVar25;
                            uVar16 = uVar16 + 1;
                          } while (bVar32);
                        }
                        if (bVar31) goto LAB_00105536;
                        cVar14 = cVar14 + 1;
                      } while (cVar14 != pcVar9[uVar27].targets_count);
                      cVar28 = '\x11';
                    }
LAB_00105536:
                    cVar18 = unaff_EBP;
                    if (cVar28 == '\x11') {
                      pcVar10 = pcVar9[uVar27].indices;
                      if (pcVar10 == (cgltf_accessor *)0x0) {
LAB_001055a1:
                        cVar28 = '\0';
                        cVar18 = unaff_EBP;
                      }
                      else {
                        cVar1 = pcVar10->component_type;
                        cVar28 = '\x01';
                        cVar18 = cgltf_result_invalid_gltf;
                        if ((cVar1 < cgltf_component_type_r_32f) &&
                           ((0x34U >> (cVar1 & 0x1f) & 1) != 0)) {
                          pcVar4 = pcVar10->buffer_view;
                          if ((pcVar4 == (cgltf_buffer_view *)0x0) ||
                             (pcVar4->buffer->data == (void *)0x0)) goto LAB_001055a1;
                          cVar14 = cgltf_calc_index_bound
                                             (pcVar4,pcVar10->offset,cVar1,pcVar10->count);
                          cVar28 = pcVar8->count <= cVar14;
                          cVar18 = unaff_EBP;
                          if ((bool)cVar28) {
                            cVar18 = cgltf_result_data_too_short;
                          }
                        }
                      }
                    }
                  }
                }
                unaff_EBP = cVar18;
                if ((cVar28 != '\r') && (cVar28 != '\0')) break;
              }
              uVar27 = uVar27 + 1;
              bVar30 = uVar27 < uVar6;
            } while (uVar27 != uVar6);
          }
          if (bVar30) break;
          uVar20 = uVar20 + 1;
          bVar29 = uVar20 < uVar3;
        } while (uVar20 != uVar3);
      }
      if (!bVar29) {
        uVar3 = data->nodes_count;
        bVar29 = uVar3 != 0;
        if (bVar29) {
          pcVar17 = &data->nodes->weights_count;
          uVar20 = 1;
          do {
            if (((((cgltf_float *)pcVar17[-1] != (cgltf_float *)0x0) &&
                 (pcVar5 = (cgltf_mesh *)pcVar17[-4], pcVar5 != (cgltf_mesh *)0x0)) &&
                (pcVar5->primitives_count != 0)) && (pcVar5->primitives->targets_count != *pcVar17))
            {
              unaff_EBP = cgltf_result_invalid_gltf;
              break;
            }
            bVar29 = uVar20 < uVar3;
            pcVar17 = pcVar17 + 0x1e;
            bVar30 = uVar20 != uVar3;
            uVar20 = uVar20 + 1;
          } while (bVar30);
        }
        if (!bVar29) {
          bVar29 = uVar3 != 0;
          if (bVar29) {
            uVar20 = 0;
            do {
              pcVar21 = data->nodes[uVar20].parent;
              if (pcVar21 == (cgltf_node *)0x0) {
                pcVar24 = (cgltf_node *)0x0;
              }
              else {
                pcVar24 = pcVar21->parent;
              }
              bVar30 = pcVar24 == (cgltf_node *)0x0 || pcVar21 == (cgltf_node *)0x0;
              if (pcVar24 != (cgltf_node *)0x0 && pcVar21 != (cgltf_node *)0x0) {
                do {
                  if (pcVar21 == pcVar24) {
                    unaff_EBP = cgltf_result_invalid_gltf;
                    break;
                  }
                  if (pcVar24->parent == (cgltf_node *)0x0) {
                    pcVar24 = (cgltf_node *)0x0;
                  }
                  else {
                    pcVar24 = pcVar24->parent->parent;
                  }
                  pcVar21 = pcVar21->parent;
                  bVar30 = pcVar24 == (cgltf_node *)0x0 || pcVar21 == (cgltf_node *)0x0;
                } while (pcVar24 != (cgltf_node *)0x0 && pcVar21 != (cgltf_node *)0x0);
              }
              if (!bVar30) break;
              uVar20 = uVar20 + 1;
              bVar29 = uVar20 < uVar3;
            } while (uVar20 != uVar3);
          }
          if (!bVar29) {
            uVar3 = data->scenes_count;
            bVar29 = uVar3 != 0;
            if (bVar29) {
              uVar20 = 0;
              do {
                uVar6 = data->scenes[uVar20].nodes_count;
                bVar30 = uVar6 != 0;
                cVar18 = unaff_EBP;
                if (bVar30) {
                  ppcVar11 = data->scenes[uVar20].nodes;
                  cVar18 = cgltf_result_invalid_gltf;
                  if ((*ppcVar11)->parent == (cgltf_node *)0x0) {
                    uVar27 = 1;
                    do {
                      uVar25 = uVar27;
                      if (uVar6 == uVar25) goto LAB_0010576e;
                      uVar27 = uVar25 + 1;
                    } while (ppcVar11[uVar25]->parent == (cgltf_node *)0x0);
                    unaff_EBP = cgltf_result_invalid_gltf;
LAB_0010576e:
                    bVar30 = uVar25 < uVar6;
                    cVar18 = unaff_EBP;
                  }
                }
                unaff_EBP = cVar18;
                if (bVar30) break;
                uVar20 = uVar20 + 1;
                bVar29 = uVar20 < uVar3;
              } while (uVar20 != uVar3);
            }
            if (!bVar29) {
              if (data->animations_count == 0) {
                unaff_EBP = cgltf_result_success;
              }
              else {
                cVar14 = 0;
                cVar18 = unaff_EBP;
                do {
                  uVar3 = data->animations[cVar14].channels_count;
                  bVar29 = uVar3 != 0;
                  if (bVar29) {
                    pcVar26 = &(data->animations[cVar14].channels)->target_path;
                    uVar20 = 1;
                    do {
                      if (*(cgltf_node **)(pcVar26 + -2) == (cgltf_node *)0x0) {
                        cVar28 = '*';
                        cVar13 = cVar18;
                      }
                      else {
                        cVar22 = 1;
                        if (*pcVar26 == cgltf_animation_path_type_weights) {
                          pcVar5 = (*(cgltf_node **)(pcVar26 + -2))->mesh;
                          cVar28 = '\x01';
                          cVar13 = cgltf_result_invalid_gltf;
                          if ((pcVar5 == (cgltf_mesh *)0x0) || (pcVar5->primitives_count == 0))
                          goto LAB_0010586d;
                          cVar22 = pcVar5->primitives->targets_count;
                        }
                        pcVar12 = ((cgltf_animation_channel *)(pcVar26 + -4))->sampler;
                        cVar28 = cVar22 * pcVar12->input->count *
                                 ((ulong)(pcVar12->interpolation ==
                                         cgltf_interpolation_type_cubic_spline) * 2 + 1) -
                                 pcVar12->output->count != 0;
                        cVar13 = cVar18;
                        if ((bool)cVar28) {
                          cVar13 = cgltf_result_data_too_short;
                        }
                      }
LAB_0010586d:
                      cVar18 = cVar13;
                      if ((cVar28 != '*') && (cVar28 != '\0')) break;
                      bVar29 = uVar20 < uVar3;
                      pcVar26 = pcVar26 + 0xe;
                      bVar30 = uVar20 != uVar3;
                      uVar20 = uVar20 + 1;
                    } while (bVar30);
                  }
                  if (bVar29) {
                    return cVar18;
                  }
                  cVar14 = cVar14 + 1;
                  unaff_EBP = cgltf_result_success;
                } while (cVar14 != data->animations_count);
              }
            }
          }
        }
      }
    }
  }
  return unaff_EBP;
}

Assistant:

cgltf_result cgltf_validate(cgltf_data* data)
{
	for (cgltf_size i = 0; i < data->accessors_count; ++i)
	{
		cgltf_accessor* accessor = &data->accessors[i];

		cgltf_size element_size = cgltf_calc_size(accessor->type, accessor->component_type);

		if (accessor->buffer_view)
		{
			cgltf_size req_size = accessor->offset + accessor->stride * (accessor->count - 1) + element_size;

			if (accessor->buffer_view->size < req_size)
			{
				return cgltf_result_data_too_short;
			}
		}

		if (accessor->is_sparse)
		{
			cgltf_accessor_sparse* sparse = &accessor->sparse;

			cgltf_size indices_component_size = cgltf_calc_size(cgltf_type_scalar, sparse->indices_component_type);
			cgltf_size indices_req_size = sparse->indices_byte_offset + indices_component_size * sparse->count;
			cgltf_size values_req_size = sparse->values_byte_offset + element_size * sparse->count;

			if (sparse->indices_buffer_view->size < indices_req_size ||
				sparse->values_buffer_view->size < values_req_size)
			{
				return cgltf_result_data_too_short;
			}

			if (sparse->indices_component_type != cgltf_component_type_r_8u &&
				sparse->indices_component_type != cgltf_component_type_r_16u &&
				sparse->indices_component_type != cgltf_component_type_r_32u)
			{
				return cgltf_result_invalid_gltf;
			}

			if (sparse->indices_buffer_view->buffer->data)
			{
				cgltf_size index_bound = cgltf_calc_index_bound(sparse->indices_buffer_view, sparse->indices_byte_offset, sparse->indices_component_type, sparse->count);

				if (index_bound >= accessor->count)
				{
					return cgltf_result_data_too_short;
				}
			}
		}
	}

	for (cgltf_size i = 0; i < data->buffer_views_count; ++i)
	{
		cgltf_size req_size = data->buffer_views[i].offset + data->buffer_views[i].size;

		if (data->buffer_views[i].buffer && data->buffer_views[i].buffer->size < req_size)
		{
			return cgltf_result_data_too_short;
		}

		if (data->buffer_views[i].has_meshopt_compression)
		{
			cgltf_meshopt_compression* mc = &data->buffer_views[i].meshopt_compression;

			if (mc->buffer == NULL || mc->buffer->size < mc->offset + mc->size)
			{
				return cgltf_result_data_too_short;
			}

			if (data->buffer_views[i].stride && mc->stride != data->buffer_views[i].stride)
			{
				return cgltf_result_invalid_gltf;
			}

			if (data->buffer_views[i].size != mc->stride * mc->count)
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->mode == cgltf_meshopt_compression_mode_invalid)
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->mode == cgltf_meshopt_compression_mode_attributes && !(mc->stride % 4 == 0 && mc->stride <= 256))
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->mode == cgltf_meshopt_compression_mode_triangles && mc->count % 3 != 0)
			{
				return cgltf_result_invalid_gltf;
			}

			if ((mc->mode == cgltf_meshopt_compression_mode_triangles || mc->mode == cgltf_meshopt_compression_mode_indices) && mc->stride != 2 && mc->stride != 4)
			{
				return cgltf_result_invalid_gltf;
			}

			if ((mc->mode == cgltf_meshopt_compression_mode_triangles || mc->mode == cgltf_meshopt_compression_mode_indices) && mc->filter != cgltf_meshopt_compression_filter_none)
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->filter == cgltf_meshopt_compression_filter_octahedral && mc->stride != 4 && mc->stride != 8)
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->filter == cgltf_meshopt_compression_filter_quaternion && mc->stride != 8)
			{
				return cgltf_result_invalid_gltf;
			}
		}
	}

	for (cgltf_size i = 0; i < data->meshes_count; ++i)
	{
		if (data->meshes[i].weights)
		{
			if (data->meshes[i].primitives_count && data->meshes[i].primitives[0].targets_count != data->meshes[i].weights_count)
			{
				return cgltf_result_invalid_gltf;
			}
		}

		if (data->meshes[i].target_names)
		{
			if (data->meshes[i].primitives_count && data->meshes[i].primitives[0].targets_count != data->meshes[i].target_names_count)
			{
				return cgltf_result_invalid_gltf;
			}
		}

		for (cgltf_size j = 0; j < data->meshes[i].primitives_count; ++j)
		{
			//
			// Skip target count check because some VRM files omit targets for root primitive
			// which is not valid for glTF but has been accepted for VRM 
			//
			//if (data->meshes[i].primitives[j].targets_count != data->meshes[i].primitives[0].targets_count)
			//{
			//	return cgltf_result_invalid_gltf;
			//}

			if (data->meshes[i].primitives[j].attributes_count)
			{
				cgltf_accessor* first = data->meshes[i].primitives[j].attributes[0].data;
				if (first == NULL) continue;

				for (cgltf_size k = 0; k < data->meshes[i].primitives[j].attributes_count; ++k)
				{
					cgltf_accessor* accessor = data->meshes[i].primitives[j].attributes[k].data;
					if (accessor && accessor->count != first->count)
					{
						return cgltf_result_invalid_gltf;
					}
				}

				for (cgltf_size k = 0; k < data->meshes[i].primitives[j].targets_count; ++k)
				{
					for (cgltf_size m = 0; m < data->meshes[i].primitives[j].targets[k].attributes_count; ++m)
					{
						cgltf_accessor* accessor = data->meshes[i].primitives[j].targets[k].attributes[m].data;
						if (accessor && accessor->count != first->count)
						{
							return cgltf_result_invalid_gltf;
						}
					}
				}

				cgltf_accessor* indices = data->meshes[i].primitives[j].indices;

				if (indices &&
					indices->component_type != cgltf_component_type_r_8u &&
					indices->component_type != cgltf_component_type_r_16u &&
					indices->component_type != cgltf_component_type_r_32u)
				{
					return cgltf_result_invalid_gltf;
				}

				if (indices && indices->buffer_view && indices->buffer_view->buffer->data)
				{
					cgltf_size index_bound = cgltf_calc_index_bound(indices->buffer_view, indices->offset, indices->component_type, indices->count);

					if (index_bound >= first->count)
					{
						return cgltf_result_data_too_short;
					}
				}
			}
		}
	}

	for (cgltf_size i = 0; i < data->nodes_count; ++i)
	{
		if (data->nodes[i].weights && data->nodes[i].mesh)
		{
			if (data->nodes[i].mesh->primitives_count && data->nodes[i].mesh->primitives[0].targets_count != data->nodes[i].weights_count)
			{
				return cgltf_result_invalid_gltf;
			}
		}
	}

	for (cgltf_size i = 0; i < data->nodes_count; ++i)
	{
		cgltf_node* p1 = data->nodes[i].parent;
		cgltf_node* p2 = p1 ? p1->parent : NULL;

		while (p1 && p2)
		{
			if (p1 == p2)
			{
				return cgltf_result_invalid_gltf;
			}

			p1 = p1->parent;
			p2 = p2->parent ? p2->parent->parent : NULL;
		}
	}

	for (cgltf_size i = 0; i < data->scenes_count; ++i)
	{
		for (cgltf_size j = 0; j < data->scenes[i].nodes_count; ++j)
		{
			if (data->scenes[i].nodes[j]->parent)
			{
				return cgltf_result_invalid_gltf;
			}
		}
	}

	for (cgltf_size i = 0; i < data->animations_count; ++i)
	{
		for (cgltf_size j = 0; j < data->animations[i].channels_count; ++j)
		{
			cgltf_animation_channel* channel = &data->animations[i].channels[j];

			if (!channel->target_node)
			{
				continue;
			}

			cgltf_size components = 1;

			if (channel->target_path == cgltf_animation_path_type_weights)
			{
				if (!channel->target_node->mesh || !channel->target_node->mesh->primitives_count)
				{
					return cgltf_result_invalid_gltf;
				}

				components = channel->target_node->mesh->primitives[0].targets_count;
			}

			cgltf_size values = channel->sampler->interpolation == cgltf_interpolation_type_cubic_spline ? 3 : 1;

			if (channel->sampler->input->count * components * values != channel->sampler->output->count)
			{
				return cgltf_result_data_too_short;
			}
		}
	}

	return cgltf_result_success;
}